

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_sasl.c
# Opt level: O1

CURLcode Curl_sasl_start(SASL *sasl,connectdata *conn,_Bool force_ir,saslprogress *progress)

{
  Curl_easy *data;
  ulong uVar1;
  bool bVar2;
  char *pcVar3;
  uint uVar4;
  CURLcode CVar5;
  size_t sVar6;
  saslstate sVar7;
  char *pcVar8;
  saslstate sVar9;
  char *resp;
  size_t len;
  char *local_50;
  size_t local_48;
  char *local_40;
  SASL *local_38;
  
  data = conn->data;
  CVar5 = CURLE_OK;
  local_50 = (char *)0x0;
  local_48 = 0;
  sasl->force_ir = force_ir;
  sasl->authused = 0;
  uVar4 = sasl->prefmech & sasl->authmechs;
  *progress = SASL_IDLE;
  if (((uVar4 & 0x20) == 0) || (*conn->passwd != '\0')) {
    sVar9 = SASL_FINAL;
    if ((conn->bits).user_passwd != true) {
LAB_0014394d:
      CVar5 = CURLE_OK;
      bVar2 = false;
      pcVar8 = (char *)0x0;
      sVar7 = SASL_STOP;
      goto LAB_00143953;
    }
    if ((uVar4 & 8) == 0) {
      if ((uVar4 & 4) == 0) {
        if ((uVar4 & 0x40) == 0) {
          if (((uVar4 >> 8 & 1) == 0) || (pcVar8 = conn->oauth_bearer, pcVar8 == (char *)0x0)) {
            if (((char)uVar4 < '\0') && (pcVar8 = conn->oauth_bearer, pcVar8 != (char *)0x0)) {
              sasl->authused = 0x80;
              if ((force_ir) || ((data->set).sasl_ir == true)) {
                CVar5 = Curl_auth_create_oauth_bearer_message
                                  (data,conn->user,(char *)0x0,0,pcVar8,&local_50,&local_48);
              }
              sVar9 = SASL_FINAL;
              sVar7 = SASL_OAUTH2;
              pcVar8 = "XOAUTH2";
            }
            else if ((uVar4 & 1) == 0) {
              CVar5 = CURLE_OK;
              if ((uVar4 & 2) == 0) goto LAB_0014394d;
              sasl->authused = 2;
              if ((force_ir) || ((data->set).sasl_ir == true)) {
                CVar5 = Curl_auth_create_plain_message
                                  (data,conn->user,conn->passwd,&local_50,&local_48);
              }
              sVar9 = SASL_FINAL;
              sVar7 = SASL_PLAIN;
              pcVar8 = "PLAIN";
            }
            else {
              sasl->authused = 1;
              if ((force_ir) || ((data->set).sasl_ir == true)) {
                CVar5 = Curl_auth_create_login_message(data,conn->user,&local_50,&local_48);
              }
              sVar9 = SASL_LOGIN_PASSWD;
              sVar7 = SASL_LOGIN;
              pcVar8 = "LOGIN";
            }
          }
          else {
            sasl->authused = 0x100;
            if ((force_ir) || ((data->set).sasl_ir == true)) {
              CVar5 = Curl_auth_create_oauth_bearer_message
                                (data,conn->user,(conn->host).name,conn->port,pcVar8,&local_50,
                                 &local_48);
            }
            sVar9 = SASL_OAUTH2_RESP;
            sVar7 = SASL_OAUTH2;
            pcVar8 = "OAUTHBEARER";
          }
        }
        else {
          sasl->authused = 0x40;
          if ((force_ir) || ((data->set).sasl_ir == true)) {
            CVar5 = Curl_auth_create_ntlm_type1_message
                              (conn->user,conn->passwd,&conn->ntlm,&local_50,&local_48);
          }
          sVar9 = SASL_NTLM_TYPE2MSG;
          sVar7 = SASL_NTLM;
          pcVar8 = "NTLM";
        }
      }
      else {
        sasl->authused = 4;
        sVar7 = SASL_CRAMMD5;
        pcVar8 = "CRAM-MD5";
      }
    }
    else {
      sasl->authused = 8;
      sVar7 = SASL_DIGESTMD5;
      pcVar8 = "DIGEST-MD5";
    }
  }
  else {
    sasl->authused = 0x20;
    if ((!force_ir) && ((data->set).sasl_ir != true)) {
      sVar9 = SASL_FINAL;
      sVar7 = SASL_EXTERNAL;
      pcVar8 = "EXTERNAL";
      bVar2 = true;
      CVar5 = CURLE_OK;
      goto LAB_00143953;
    }
    CVar5 = Curl_auth_create_external_message(data,conn->user,&local_50,&local_48);
    sVar9 = SASL_FINAL;
    sVar7 = SASL_EXTERNAL;
    pcVar8 = "EXTERNAL";
  }
  bVar2 = true;
LAB_00143953:
  pcVar3 = local_50;
  if (bVar2 && CVar5 == CURLE_OK) {
    if ((local_50 != (char *)0x0) && (uVar1 = sasl->params->maxirlen, uVar1 != 0)) {
      local_40 = pcVar8;
      local_38 = sasl;
      sVar6 = strlen(pcVar8);
      pcVar8 = local_40;
      sasl = local_38;
      if (uVar1 < sVar6 + local_48) {
        (*Curl_cfree)(pcVar3);
        local_50 = (char *)0x0;
        pcVar8 = local_40;
        sasl = local_38;
      }
    }
    CVar5 = (*sasl->params->sendauth)(conn,pcVar8,local_50);
    if (CVar5 == CURLE_OK) {
      *progress = SASL_INPROGRESS;
      if (local_50 == (char *)0x0) {
        sVar9 = sVar7;
      }
      sasl->state = sVar9;
      CVar5 = CURLE_OK;
    }
  }
  (*Curl_cfree)(local_50);
  return CVar5;
}

Assistant:

CURLcode Curl_sasl_start(struct SASL *sasl, struct connectdata *conn,
                         bool force_ir, saslprogress *progress)
{
  CURLcode result = CURLE_OK;
  struct Curl_easy *data = conn->data;
  unsigned int enabledmechs;
  const char *mech = NULL;
  char *resp = NULL;
  size_t len = 0;
  saslstate state1 = SASL_STOP;
  saslstate state2 = SASL_FINAL;
#if defined(USE_KERBEROS5)
  const char* service = data->set.str[STRING_SERVICE_NAME] ?
                        data->set.str[STRING_SERVICE_NAME] :
                        sasl->params->service;
#endif

  sasl->force_ir = force_ir;    /* Latch for future use */
  sasl->authused = 0;           /* No mechanism used yet */
  enabledmechs = sasl->authmechs & sasl->prefmech;
  *progress = SASL_IDLE;

  /* Calculate the supported authentication mechanism, by decreasing order of
     security, as well as the initial response where appropriate */
  if((enabledmechs & SASL_MECH_EXTERNAL) && !conn->passwd[0]) {
    mech = SASL_MECH_STRING_EXTERNAL;
    state1 = SASL_EXTERNAL;
    sasl->authused = SASL_MECH_EXTERNAL;

    if(force_ir || data->set.sasl_ir)
      result = Curl_auth_create_external_message(data, conn->user, &resp,
                                                 &len);
  }
  else if(conn->bits.user_passwd) {
#if defined(USE_KERBEROS5)
    if(enabledmechs & SASL_MECH_GSSAPI) {
      sasl->mutual_auth = FALSE; /* TODO: Calculate mutual authentication */
      mech = SASL_MECH_STRING_GSSAPI;
      state1 = SASL_GSSAPI;
      state2 = SASL_GSSAPI_TOKEN;
      sasl->authused = SASL_MECH_GSSAPI;

      if(force_ir || data->set.sasl_ir)
        result = Curl_auth_create_gssapi_user_message(data, conn->user,
                                                      conn->passwd,
                                                      service,
                                                      data->easy_conn->
                                                            host.name,
                                                      sasl->mutual_auth,
                                                      NULL, &conn->krb5,
                                                      &resp, &len);
    }
    else
#endif
#ifndef CURL_DISABLE_CRYPTO_AUTH
    if(enabledmechs & SASL_MECH_DIGEST_MD5) {
      mech = SASL_MECH_STRING_DIGEST_MD5;
      state1 = SASL_DIGESTMD5;
      sasl->authused = SASL_MECH_DIGEST_MD5;
    }
    else if(enabledmechs & SASL_MECH_CRAM_MD5) {
      mech = SASL_MECH_STRING_CRAM_MD5;
      state1 = SASL_CRAMMD5;
      sasl->authused = SASL_MECH_CRAM_MD5;
    }
    else
#endif
#ifdef USE_NTLM
    if(enabledmechs & SASL_MECH_NTLM) {
      mech = SASL_MECH_STRING_NTLM;
      state1 = SASL_NTLM;
      state2 = SASL_NTLM_TYPE2MSG;
      sasl->authused = SASL_MECH_NTLM;

      if(force_ir || data->set.sasl_ir)
        result = Curl_auth_create_ntlm_type1_message(conn->user, conn->passwd,
                                                     &conn->ntlm, &resp, &len);
      }
    else
#endif
    if((enabledmechs & SASL_MECH_OAUTHBEARER) && conn->oauth_bearer) {
      mech = SASL_MECH_STRING_OAUTHBEARER;
      state1 = SASL_OAUTH2;
      state2 = SASL_OAUTH2_RESP;
      sasl->authused = SASL_MECH_OAUTHBEARER;

      if(force_ir || data->set.sasl_ir)
        result = Curl_auth_create_oauth_bearer_message(data, conn->user,
                                                       conn->host.name,
                                                       conn->port,
                                                       conn->oauth_bearer,
                                                       &resp, &len);
    }
    else if((enabledmechs & SASL_MECH_XOAUTH2) && conn->oauth_bearer) {
      mech = SASL_MECH_STRING_XOAUTH2;
      state1 = SASL_OAUTH2;
      sasl->authused = SASL_MECH_XOAUTH2;

      if(force_ir || data->set.sasl_ir)
        result = Curl_auth_create_oauth_bearer_message(data, conn->user,
                                                       NULL, 0,
                                                       conn->oauth_bearer,
                                                       &resp, &len);
    }
    else if(enabledmechs & SASL_MECH_LOGIN) {
      mech = SASL_MECH_STRING_LOGIN;
      state1 = SASL_LOGIN;
      state2 = SASL_LOGIN_PASSWD;
      sasl->authused = SASL_MECH_LOGIN;

      if(force_ir || data->set.sasl_ir)
        result = Curl_auth_create_login_message(data, conn->user, &resp, &len);
    }
    else if(enabledmechs & SASL_MECH_PLAIN) {
      mech = SASL_MECH_STRING_PLAIN;
      state1 = SASL_PLAIN;
      sasl->authused = SASL_MECH_PLAIN;

      if(force_ir || data->set.sasl_ir)
        result = Curl_auth_create_plain_message(data, conn->user, conn->passwd,
                                                &resp, &len);
    }
  }

  if(!result && mech) {
    if(resp && sasl->params->maxirlen &&
       strlen(mech) + len > sasl->params->maxirlen) {
      free(resp);
      resp = NULL;
    }

    result = sasl->params->sendauth(conn, mech, resp);
    if(!result) {
      *progress = SASL_INPROGRESS;
      state(sasl, conn, resp ? state2 : state1);
    }
  }

  free(resp);

  return result;
}